

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPipelineStatisticsQueryTests.cpp
# Opt level: O3

void __thiscall
glcts::PipelineStatisticsQueryTestFunctional2::PipelineStatisticsQueryTestFunctional2
          (PipelineStatisticsQueryTestFunctional2 *this,Context *context)

{
  tcu::TestCase::TestCase
            ((TestCase *)this,context->m_testCtx,
             "functional_non_rendering_commands_do_not_affect_queries",
             "Verifies that non-rendering commands do not affect query values.");
  (this->super_PipelineStatisticsQueryTestFunctionalBase).super_TestCase.m_context = context;
  (this->super_PipelineStatisticsQueryTestFunctionalBase).m_bo_qo_id = 0;
  (this->super_PipelineStatisticsQueryTestFunctionalBase).m_fbo_id = 0;
  (this->super_PipelineStatisticsQueryTestFunctionalBase).m_po_id = 0;
  (this->super_PipelineStatisticsQueryTestFunctionalBase).m_qo_id = 0;
  (this->super_PipelineStatisticsQueryTestFunctionalBase).m_qo_id = 0;
  (this->super_PipelineStatisticsQueryTestFunctionalBase).m_to_id = 0;
  (this->super_PipelineStatisticsQueryTestFunctionalBase).m_vao_id = 0;
  (this->super_PipelineStatisticsQueryTestFunctionalBase).m_vbo_id = 0;
  (this->super_PipelineStatisticsQueryTestFunctionalBase).m_to_height = 0x40;
  (this->super_PipelineStatisticsQueryTestFunctionalBase).m_to_width = 0x40;
  (this->super_PipelineStatisticsQueryTestFunctionalBase).m_indirect_draw_call_baseinstance_argument
       = 0;
  (this->super_PipelineStatisticsQueryTestFunctionalBase).m_indirect_draw_call_basevertex_argument =
       0;
  (this->super_PipelineStatisticsQueryTestFunctionalBase).m_indirect_draw_call_count_argument = 0;
  (this->super_PipelineStatisticsQueryTestFunctionalBase).m_indirect_draw_call_first_argument = 0;
  (this->super_PipelineStatisticsQueryTestFunctionalBase).m_indirect_draw_call_firstindex_argument =
       0;
  (this->super_PipelineStatisticsQueryTestFunctionalBase).m_indirect_draw_call_primcount_argument =
       0;
  (this->super_PipelineStatisticsQueryTestFunctionalBase).super_TestCase.super_TestCase.
  super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_020ec650;
  this->m_bo_id = 0;
  this->m_fbo_draw_id = 0;
  this->m_fbo_read_id = 0;
  this->m_to_draw_fbo_id = 0;
  this->m_to_read_fbo_id = 0;
  this->m_to_height = 0x10;
  this->m_to_width = 0x10;
  return;
}

Assistant:

PipelineStatisticsQueryTestFunctional2::PipelineStatisticsQueryTestFunctional2(deqp::Context& context)
	: PipelineStatisticsQueryTestFunctionalBase(context, "functional_non_rendering_commands_do_not_affect_queries",
												"Verifies that non-rendering commands do not affect query"
												" values.")
	, m_bo_id(0)
	, m_fbo_draw_id(0)
	, m_fbo_read_id(0)
	, m_to_draw_fbo_id(0)
	, m_to_read_fbo_id(0)
	, m_to_height(16)
	, m_to_width(16)
{
	/* Left blank intentionally */
}